

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O0

void __thiscall FFlatVertexBuffer::CreateFlatVBO(FFlatVertexBuffer *this)

{
  F3DFloor *pFVar1;
  uint uVar2;
  sector_t *sec;
  secplane_t *plane;
  F3DFloor **ppFVar3;
  F3DFloor *ff;
  uint j;
  int i_1;
  int i;
  int h;
  FFlatVertexBuffer *this_local;
  
  for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
    for (j = 0; (int)j < numsectors; j = j + 1) {
      sec = sectors + (int)j;
      plane = sector_t::GetSecPlane(sectors + (int)j,i_1);
      CreateVertices(this,i_1,sec,plane,(uint)(i_1 == 0));
    }
  }
  for (ff._4_4_ = 0; ff._4_4_ < numsectors; ff._4_4_ = ff._4_4_ + 1) {
    ff._0_4_ = 0;
    while( true ) {
      uVar2 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                        ((TArray<F3DFloor_*,_F3DFloor_*> *)&(sectors[ff._4_4_].e)->XFloor);
      if (uVar2 <= (uint)ff) break;
      ppFVar3 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&(sectors[ff._4_4_].e)->XFloor,
                           (ulong)(uint)ff);
      pFVar1 = *ppFVar3;
      if ((pFVar1->top).model == sectors + ff._4_4_) {
        (pFVar1->top).vindex = sectors[ff._4_4_].vboindex[(pFVar1->top).isceiling];
      }
      if ((pFVar1->bottom).model == sectors + ff._4_4_) {
        (pFVar1->bottom).vindex = sectors[ff._4_4_].vboindex[(pFVar1->top).isceiling];
      }
      ff._0_4_ = (uint)ff + 1;
    }
  }
  return;
}

Assistant:

void FFlatVertexBuffer::CreateFlatVBO()
{
	for (int h = sector_t::floor; h <= sector_t::ceiling; h++)
	{
		for(int i=0; i<numsectors;i++)
		{
			CreateVertices(h, &sectors[i], sectors[i].GetSecPlane(h), h == sector_t::floor);
		}
	}

	// We need to do a final check for Vavoom water and FF_FIX sectors.
	// No new vertices are needed here. The planes come from the actual sector
	for(int i=0; i<numsectors;i++)
	{
		for(unsigned j=0;j<sectors[i].e->XFloor.ffloors.Size(); j++)
		{
			F3DFloor *ff = sectors[i].e->XFloor.ffloors[j];

			if (ff->top.model == &sectors[i])
			{
				ff->top.vindex = sectors[i].vboindex[ff->top.isceiling];
			}
			if (ff->bottom.model == &sectors[i])
			{
				ff->bottom.vindex = sectors[i].vboindex[ff->top.isceiling];
			}
		}
	}
}